

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryCreate(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this_00;
  Var pvVar6;
  RecyclableObject *pRVar7;
  RecyclableObject *local_88;
  RecyclableObject *properties;
  DynamicObject *object;
  RecyclableObject *protoObj;
  Var protoVar;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x72d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  protoVar = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x733,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    JavascriptError::ThrowTypeError((ScriptContext *)protoVar,-0x7ff5ec31,L"Object.create");
  }
  protoObj = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
  BVar3 = Js::JavascriptOperators::IsObjectOrNull(protoObj);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)protoVar,-0x7ff5ec31,L"Object.create");
  }
  object = (DynamicObject *)VarTo<Js::RecyclableObject>(protoObj);
  this_00 = RecyclableObject::GetLibrary(function);
  properties = &JavascriptLibrary::CreateObject(this_00,&object->super_RecyclableObject,0)->
                super_RecyclableObject;
  bVar2 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar2) {
    pRVar7 = Js::JavascriptProxy::AutoProxyWrapper(properties);
    properties = &VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar7)->super_RecyclableObject;
  }
  if (2 < ((uint)scriptContext & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,2);
    if (pvVar6 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = TaggedInt::Is(pvVar6);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar6);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(pRVar7);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
    if (local_18 != TypeIds_Undefined) {
      local_88 = (RecyclableObject *)0x0;
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,2);
      BVar3 = JavascriptConversion::ToObject(pvVar6,(ScriptContext *)protoVar,&local_88);
      if (BVar3 != 0) {
        pvVar6 = DefinePropertiesHelper(properties,local_88,(ScriptContext *)protoVar);
        return pvVar6;
      }
      JavascriptError::ThrowTypeError((ScriptContext *)protoVar,-0x7ff5ec32,L"Object.create");
    }
  }
  return properties;
}

Assistant:

Var JavascriptObject::EntryCreate(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();


    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_create)

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2)
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NotObjectOrNull, _u("Object.create"));
    }

    Var protoVar = args[1];
    if (!JavascriptOperators::IsObjectOrNull(protoVar))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NotObjectOrNull, _u("Object.create"));
    }

    RecyclableObject* protoObj = VarTo<RecyclableObject>(protoVar);
    DynamicObject* object = function->GetLibrary()->CreateObject(protoObj);

    JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(object));
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
    {
        object = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(object));
    }
#endif

    if (args.Info.Count > 2 && JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
    {
        RecyclableObject* properties = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[2], scriptContext, &properties))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NullOrUndefined, _u("Object.create"));
        }
        return DefinePropertiesHelper(object, properties, scriptContext);
    }
    return object;
}